

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

void Wlc_WinCleanMark_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_24;
  int i;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((*(ushort *)pObj >> 7 & 1) != 0) {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f;
    for (local_24 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      iVar1 = Wlc_ObjFaninId(pObj,local_24);
      pObj_00 = Wlc_NtkObj(p,iVar1);
      Wlc_WinCleanMark_rec(p,pObj_00);
    }
  }
  return;
}

Assistant:

void Wlc_WinCleanMark_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( !pObj->Mark )
        return;
    pObj->Mark = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCleanMark_rec( p, pFanin );
}